

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

CAmount wallet::CachedTxGetDebit(CWallet *wallet,CWalletTx *wtx,isminefilter *filter)

{
  element_type *peVar1;
  CAmount CVar2;
  long in_FS_OFFSET;
  isminefilter get_amount_filter;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start ==
       (peVar1->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish) || (local_c = *filter & 3, local_c == 0)) {
    CVar2 = 0;
  }
  else {
    CVar2 = GetCachableAmount(wallet,wtx,DEBIT,&local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CVar2;
  }
  __stack_chk_fail();
}

Assistant:

CAmount CachedTxGetDebit(const CWallet& wallet, const CWalletTx& wtx, const isminefilter& filter)
{
    if (wtx.tx->vin.empty())
        return 0;

    CAmount debit = 0;
    const isminefilter get_amount_filter{filter & ISMINE_ALL};
    if (get_amount_filter) {
        debit += GetCachableAmount(wallet, wtx, CWalletTx::DEBIT, get_amount_filter);
    }
    return debit;
}